

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_vector_quantity.cpp
# Opt level: O0

void __thiscall
polyscope::SurfaceFaceVectorQuantity::SurfaceFaceVectorQuantity
          (SurfaceFaceVectorQuantity *this,string *name,
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          *vectors_,SurfaceMesh *mesh_,VectorType vectorType_)

{
  SurfaceVectorQuantity *in_RCX;
  string *in_RSI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  VectorType unaff_retaddr;
  ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *in_stack_00000008;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *in_stack_00000010;
  SurfaceFaceVectorQuantity *in_stack_00000018;
  VectorQuantity<polyscope::SurfaceFaceVectorQuantity> *in_stack_00000020;
  string local_48 [20];
  MeshElement in_stack_ffffffffffffffcc;
  SurfaceMesh *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  
  std::__cxx11::string::string(local_48,in_RSI);
  SurfaceVectorQuantity::SurfaceVectorQuantity
            (in_RCX,(string *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffcc);
  std::__cxx11::string::~string(local_48);
  *in_RDI = &PTR__SurfaceFaceVectorQuantity_0098d590;
  VectorQuantity<polyscope::SurfaceFaceVectorQuantity>::VectorQuantity
            (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr);
  *in_RDI = &PTR__SurfaceFaceVectorQuantity_0098d590;
  return;
}

Assistant:

SurfaceFaceVectorQuantity::SurfaceFaceVectorQuantity(std::string name, std::vector<glm::vec3> vectors_,
                                                     SurfaceMesh& mesh_, VectorType vectorType_)
    : SurfaceVectorQuantity(name, mesh_, MeshElement::FACE),
      VectorQuantity<SurfaceFaceVectorQuantity>(*this, vectors_, parent.faceCenters, vectorType_) {}